

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double eval_guided_crit<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *buffer_arr,
                 size_t *buffer_pos,bool as_relative_gain,double *saved_xmedian,double *split_point,
                 double *xmin,double *xmax,GainCriterion criterion,double min_gain,
                 MissingAction missing_action,size_t *cols_use,size_t ncols_use,bool force_cols_use,
                 double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  ulong uVar1;
  size_t *__first;
  size_t ix;
  long lVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  MissingAction missing_action_00;
  ulong end_00;
  bool as_relative_gain_00;
  long lVar8;
  double dVar9;
  double dVar10;
  size_t ignored;
  size_t local_38;
  
  as_relative_gain_00 = as_relative_gain;
  __first = buffer_pos;
  pdVar5 = buffer_arr;
  todense<double,unsigned_long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  end_00 = end - st;
  uVar1 = end_00 + 1;
  lVar8 = end * 8 + st * -8;
  sVar6 = 0;
  for (lVar2 = lVar8 + 8; lVar2 != 0; lVar2 = lVar2 + -8) {
    __first[sVar6] = sVar6;
    sVar6 = sVar6 + 1;
  }
  missing_action_00 = missing_action;
  if (missing_action == Impute) {
    missing_action_00 = Fail;
    uVar3 = 0;
    do {
      as_relative_gain_00 = as_relative_gain;
      if (uVar1 == uVar3) goto LAB_0021c7b0;
      pdVar7 = pdVar5 + uVar3;
      uVar3 = uVar3 + 1;
    } while ((ulong)ABS(*pdVar7) < 0x7ff0000000000000);
    puVar4 = (unsigned_long *)((long)__first + (uVar1 & 0xfffffffffffffffe) * 4);
    std::
    nth_element<unsigned_long*,eval_guided_crit<double,unsigned_long,long_double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,double*,unsigned_long*,unsigned_long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>
              (__first,puVar4,__first + end_00 + 1,(anon_class_8_1_0f1c67a0)&buffer_arr);
    dVar9 = buffer_arr[*puVar4];
    *saved_xmedian = dVar9;
    pdVar5 = buffer_arr;
    uVar3 = uVar1;
    if ((end_00 & 1) != 0) {
      puVar4 = std::__max_element<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(__first,puVar4);
      dVar10 = ((double)CONCAT44(0x45300000,(int)(*puVar4 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)*puVar4) - 4503599627370496.0);
      *saved_xmedian = (dVar9 - dVar10) * 0.5 + dVar10;
      pdVar5 = buffer_arr;
    }
    while (uVar3 != 0) {
      pdVar7 = saved_xmedian;
      if ((ulong)ABS(*pdVar5) < 0x7ff0000000000000) {
        pdVar7 = pdVar5;
      }
      *pdVar5 = *pdVar7;
      pdVar5 = pdVar5 + 1;
      uVar3 = uVar3 - 1;
    }
    sVar6 = 0;
    for (lVar8 = lVar8 + 8; pdVar5 = buffer_arr, as_relative_gain_00 = as_relative_gain,
        missing_action_00 = Fail, lVar8 != 0; lVar8 = lVar8 + -8) {
      __first[sVar6] = sVar6;
      sVar6 = sVar6 + 1;
    }
  }
LAB_0021c7b0:
  dVar9 = eval_guided_crit<double,long_double>
                    (__first,0,end_00,pdVar5,pdVar5 + uVar1,as_relative_gain_00,saved_xmedian,
                     (double *)0x0,&local_38,split_point,xmin,xmax,criterion,min_gain,
                     missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,ncols,Xr,Xr_ind
                     ,Xr_indptr);
  return dVar9;
}

Assistant:

double eval_guided_crit(size_t ix_arr[], size_t st, size_t end,
                        size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                        double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                        double *restrict saved_xmedian,
                        double &split_point, double &xmin, double &xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);

    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }

    no_nas:
    return eval_guided_crit<double, ldouble_safe>(
                            buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                            as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                            xmin, xmax, criterion, min_gain, missing_action,
                            cols_use, ncols_use, force_cols_use,
                            X_row_major, ncols,
                            Xr, Xr_ind, Xr_indptr);
}